

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_partial_forceExtDict
              (char *source,char *dest,int compressedSize,int targetOutputSize,int dstCapacity,
              void *dictStart,size_t dictSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  ushort uVar6;
  undefined8 uVar7;
  ushort uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ushort *puVar12;
  ushort *puVar13;
  uint uVar14;
  ulong uVar15;
  BYTE *d;
  byte *pbVar16;
  byte *pbVar17;
  ushort *puVar18;
  BYTE *e;
  byte *__dest;
  ulong uVar19;
  ulong uVar20;
  BYTE *s_1;
  ushort *__src;
  int local_58;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  iVar9 = -1;
  if (-1 < dstCapacity && source != (char *)0x0) {
    lVar10 = (long)dictStart + dictSize;
    if (dictStart == (void *)0x0) {
      lVar10 = 0;
    }
    if (dstCapacity == 0) {
      iVar9 = 0;
    }
    else if (compressedSize != 0) {
      pbVar2 = (byte *)(source + compressedSize);
      pbVar3 = (byte *)(dest + (uint)dstCapacity);
      __dest = (byte *)dest;
      puVar12 = (ushort *)source;
      if ((uint)dstCapacity < 0x40) goto LAB_001139e4;
      puVar1 = (ushort *)(pbVar2 + -0xf);
      puVar13 = (ushort *)source;
LAB_0011329c:
      while( true ) {
        __src = (ushort *)((long)puVar13 + 1);
        bVar5 = (byte)*puVar13;
        uVar14 = (uint)bVar5;
        uVar19 = (ulong)(uint)(bVar5 >> 4);
        if (bVar5 >> 4 == 0xf) {
          puVar18 = __src;
          if ((puVar1 <= __src) || (puVar18 = puVar13 + 1, puVar1 < puVar18)) goto LAB_00113668;
          uVar19 = (ulong)*(byte *)__src;
          if (uVar19 == 0xff) {
            uVar19 = 0xff;
            puVar12 = puVar18;
            do {
              puVar18 = (ushort *)((long)puVar12 + 1);
              if (puVar1 < puVar18) goto LAB_00113668;
              uVar6 = *puVar12;
              uVar19 = uVar19 + (byte)uVar6;
              puVar12 = puVar18;
            } while ((ulong)(byte)uVar6 == 0xff);
            if (uVar19 == 0xffffffffffffffff) goto LAB_00113668;
          }
          uVar19 = uVar19 + 0xf;
          puVar12 = (ushort *)((long)puVar18 + uVar19);
          pbVar16 = __dest + uVar19;
          if ((CARRY8((ulong)__dest,uVar19)) || (CARRY8((ulong)puVar18,uVar19))) goto LAB_00113668;
          __src = puVar18;
          if (dest + ((ulong)(uint)dstCapacity - 0x20) < pbVar16) goto LAB_00113759;
          if (pbVar2 + -0x20 < puVar12) goto LAB_00113759;
          lVar11 = 0;
          do {
            uVar7 = *(undefined8 *)((byte *)((long)puVar18 + lVar11) + 8);
            pbVar17 = __dest + lVar11;
            *(undefined8 *)pbVar17 = *(undefined8 *)((long)puVar18 + lVar11);
            *(undefined8 *)(pbVar17 + 8) = uVar7;
            pbVar4 = (byte *)((long)puVar18 + lVar11 + 0x10);
            uVar7 = *(undefined8 *)(pbVar4 + 8);
            *(undefined8 *)(pbVar17 + 0x10) = *(undefined8 *)pbVar4;
            *(undefined8 *)(pbVar17 + 0x18) = uVar7;
            lVar11 = lVar11 + 0x20;
          } while (pbVar17 + 0x20 < pbVar16);
        }
        else {
          if (pbVar2 + -0x11 < __src) goto LAB_00113759;
          uVar7 = *(undefined8 *)((long)puVar13 + 9);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar7;
          puVar12 = (ushort *)((long)__src + uVar19);
          pbVar16 = __dest + uVar19;
        }
        uVar6 = *puVar12;
        uVar20 = (ulong)uVar6;
        puVar13 = puVar12 + 1;
        pbVar17 = pbVar16 + -uVar20;
        uVar15 = (ulong)(bVar5 & 0xf);
        if (uVar15 == 0xf) break;
        __dest = pbVar16 + uVar15 + 4;
        uVar15 = uVar15 + 4;
        puVar12 = puVar13;
        if (pbVar3 + -0x40 <= __dest) goto LAB_0011385e;
        if ((pbVar17 < dest) || (uVar6 < 8)) goto LAB_001133e6;
        *(undefined8 *)pbVar16 = *(undefined8 *)pbVar17;
        *(undefined8 *)(pbVar16 + 8) = *(undefined8 *)(pbVar17 + 8);
        *(undefined2 *)(pbVar16 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
      }
      puVar12 = (ushort *)((long)puVar12 + 3);
      puVar18 = puVar12;
      if (pbVar2 + -4 < puVar12) goto LAB_00113668;
      uVar15 = (ulong)(byte)*puVar13;
      if (uVar15 == 0xff) {
        uVar15 = 0xff;
        puVar13 = puVar12;
        do {
          puVar12 = (ushort *)((long)puVar13 + 1);
          puVar18 = puVar12;
          if (pbVar2 + -4 < puVar12) goto LAB_00113668;
          uVar8 = *puVar13;
          uVar15 = uVar15 + (byte)uVar8;
          puVar13 = puVar12;
        } while ((ulong)(byte)uVar8 == 0xff);
        if (uVar15 == 0xffffffffffffffff) goto LAB_00113668;
      }
      uVar15 = uVar15 + 0x13;
      puVar18 = puVar12;
      if (CARRY8((ulong)pbVar16,uVar15)) goto LAB_00113668;
      puVar13 = puVar12;
      if (pbVar16 + uVar15 < pbVar3 + -0x40) {
LAB_001133e6:
        if ((dictSize < 0x10000) && (puVar18 = puVar13, pbVar17 + dictSize < dest))
        goto LAB_00113668;
        __dest = pbVar16 + uVar15;
        if (dest <= pbVar17) {
          if (0xf < uVar6) {
            do {
              uVar7 = *(undefined8 *)(pbVar16 + -uVar20 + 8);
              *(undefined8 *)pbVar16 = *(undefined8 *)(pbVar16 + -uVar20);
              *(undefined8 *)(pbVar16 + 8) = uVar7;
              uVar7 = *(undefined8 *)(pbVar16 + -uVar20 + 0x10 + 8);
              *(undefined8 *)(pbVar16 + 0x10) = *(undefined8 *)(pbVar16 + -uVar20 + 0x10);
              *(undefined8 *)(pbVar16 + 0x18) = uVar7;
              pbVar16 = pbVar16 + 0x20;
            } while (pbVar16 < __dest);
            goto LAB_0011329c;
          }
          if (uVar20 == 4) {
            iVar9 = *(int *)pbVar17;
          }
          else if (uVar6 == 2) {
            iVar9 = CONCAT22(*(undefined2 *)pbVar17,*(undefined2 *)pbVar17);
          }
          else {
            if (uVar6 != 1) {
              if (uVar6 < 8) {
                pbVar16[0] = 0;
                pbVar16[1] = 0;
                pbVar16[2] = 0;
                pbVar16[3] = 0;
                *pbVar16 = *pbVar17;
                pbVar16[1] = pbVar17[1];
                pbVar16[2] = pbVar17[2];
                pbVar16[3] = pbVar17[3];
                uVar14 = inc32table[uVar6];
                *(undefined4 *)(pbVar16 + 4) = *(undefined4 *)(pbVar17 + uVar14);
                pbVar17 = pbVar17 + ((ulong)uVar14 - (long)dec64table[uVar6]);
              }
              else {
                *(undefined8 *)pbVar16 = *(undefined8 *)pbVar17;
                pbVar17 = pbVar17 + 8;
              }
              pbVar16 = pbVar16 + 8;
              do {
                *(undefined8 *)pbVar16 = *(undefined8 *)pbVar17;
                pbVar16 = pbVar16 + 8;
                pbVar17 = pbVar17 + 8;
              } while (pbVar16 < __dest);
              goto LAB_0011329c;
            }
            iVar9 = (uint)*pbVar17 * 0x1010101;
          }
          *(int *)pbVar16 = iVar9;
          *(int *)(pbVar16 + 4) = iVar9;
          if (8 < (long)uVar15) {
            pbVar16 = pbVar16 + 8;
            do {
              *(int *)pbVar16 = iVar9;
              *(int *)(pbVar16 + 4) = iVar9;
              pbVar16 = pbVar16 + 8;
            } while (pbVar16 < __dest);
          }
          goto LAB_0011329c;
        }
        if ((pbVar3 + -5 < __dest) && ((ulong)((long)pbVar3 - (long)pbVar16) <= uVar15)) {
          uVar15 = (long)pbVar3 - (long)pbVar16;
        }
        uVar19 = (long)dest - (long)pbVar17;
        uVar20 = uVar15 - uVar19;
        if (uVar15 < uVar19 || uVar20 == 0) {
          memmove(pbVar16,(void *)(lVar10 - uVar19),uVar15);
        }
        else {
          memcpy(pbVar16,(void *)(lVar10 - uVar19),uVar19);
          __dest = pbVar16 + uVar19;
          if ((ulong)((long)__dest - (long)dest) < uVar20) {
            if ((long)uVar19 < (long)uVar15) {
              pbVar17 = (byte *)dest;
              do {
                bVar5 = *pbVar17;
                pbVar17 = pbVar17 + 1;
                *__dest = bVar5;
                __dest = __dest + 1;
              } while (__dest < pbVar16 + uVar15);
            }
            goto LAB_0011329c;
          }
          memcpy(__dest,dest,uVar20);
        }
        __dest = pbVar16 + uVar15;
        goto LAB_0011329c;
      }
LAB_0011385e:
      do {
        if ((dictSize < 0x10000) && (puVar18 = puVar12, pbVar17 + dictSize < dest))
        goto LAB_00113668;
        __dest = pbVar16 + uVar15;
        if (pbVar17 < dest) {
          if ((pbVar3 + -5 < __dest) && ((ulong)((long)pbVar3 - (long)pbVar16) <= uVar15)) {
            uVar15 = (long)pbVar3 - (long)pbVar16;
          }
          uVar19 = (long)dest - (long)pbVar17;
          uVar20 = uVar15 - uVar19;
          if (uVar15 < uVar19 || uVar20 == 0) {
            memmove(pbVar16,(void *)(lVar10 - uVar19),uVar15);
          }
          else {
            memcpy(pbVar16,(void *)(lVar10 - uVar19),uVar19);
            __dest = pbVar16 + uVar19;
            if ((ulong)((long)__dest - (long)dest) < uVar20) {
              if ((long)uVar19 < (long)uVar15) {
                pbVar17 = (byte *)dest;
                do {
                  bVar5 = *pbVar17;
                  pbVar17 = pbVar17 + 1;
                  *__dest = bVar5;
                  __dest = __dest + 1;
                } while (__dest < pbVar16 + uVar15);
              }
              goto LAB_001139e4;
            }
            memcpy(__dest,dest,uVar20);
          }
          __dest = pbVar16 + uVar15;
        }
        else if (pbVar3 + -0xc < __dest) {
          uVar19 = (long)pbVar3 - (long)pbVar16;
          if (uVar15 < (ulong)((long)pbVar3 - (long)pbVar16)) {
            uVar19 = uVar15;
          }
          __dest = pbVar16 + uVar19;
          if (pbVar16 < pbVar17 + uVar19) {
            if (0 < (long)uVar19) {
              do {
                bVar5 = *pbVar17;
                pbVar17 = pbVar17 + 1;
                *pbVar16 = bVar5;
                pbVar16 = pbVar16 + 1;
              } while (pbVar16 < __dest);
            }
          }
          else {
            memcpy(pbVar16,pbVar17,uVar19);
          }
          pbVar16 = pbVar3;
          if (__dest == pbVar3) goto LAB_00113a25;
        }
        else {
          if ((uint)uVar20 < 8) {
            pbVar16[0] = 0;
            pbVar16[1] = 0;
            pbVar16[2] = 0;
            pbVar16[3] = 0;
            *pbVar16 = *pbVar17;
            pbVar16[1] = pbVar17[1];
            pbVar16[2] = pbVar17[2];
            pbVar16[3] = pbVar17[3];
            uVar19 = (ulong)((uint)uVar20 << 2);
            uVar20 = (ulong)*(uint *)((long)inc32table + uVar19);
            *(undefined4 *)(pbVar16 + 4) = *(undefined4 *)(pbVar17 + uVar20);
            pbVar17 = pbVar17 + (uVar20 - (long)*(int *)((long)dec64table + uVar19));
          }
          else {
            *(undefined8 *)pbVar16 = *(undefined8 *)pbVar17;
            pbVar17 = pbVar17 + 8;
          }
          *(undefined8 *)(pbVar16 + 8) = *(undefined8 *)pbVar17;
          if (0x10 < uVar15) {
            pbVar16 = pbVar16 + 0x10;
            do {
              pbVar17 = pbVar17 + 8;
              *(undefined8 *)pbVar16 = *(undefined8 *)pbVar17;
              pbVar16 = pbVar16 + 8;
            } while (pbVar16 < __dest);
          }
        }
LAB_001139e4:
        __src = (ushort *)((long)puVar12 + 1);
        bVar5 = (byte)*puVar12;
        while( true ) {
          uVar14 = (uint)bVar5;
          if (bVar5 >> 4 == 0xf) break;
          uVar19 = (ulong)(uint)(bVar5 >> 4);
          if ((source + (long)compressedSize + -0x10 <= __src) ||
             (dest + ((ulong)(uint)dstCapacity - 0x20) < __dest)) goto LAB_00113759;
          uVar7 = *(undefined8 *)(__src + 4);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar7;
          pbVar16 = __dest + uVar19;
          uVar15 = (ulong)(uVar14 & 0xf);
          puVar12 = (ushort *)((long)__src + uVar19) + 1;
          uVar6 = *(ushort *)((long)__src + uVar19);
          uVar20 = (ulong)uVar6;
          pbVar17 = pbVar16 + -uVar20;
          if ((((uVar14 & 0xf) == 0xf) || (uVar6 < 8)) || (pbVar17 < dest)) goto LAB_00113807;
          *(undefined8 *)pbVar16 = *(undefined8 *)pbVar17;
          *(undefined8 *)(pbVar16 + 8) = *(undefined8 *)(pbVar17 + 8);
          *(undefined2 *)(pbVar16 + 0x10) = *(undefined2 *)(pbVar17 + 0x10);
          __dest = pbVar16 + uVar15 + 4;
          bVar5 = *(byte *)((long)__src + uVar19 + 2);
          __src = (ushort *)((long)__src + uVar19 + 3);
        }
        puVar1 = (ushort *)(pbVar2 + -0xf);
        puVar18 = __src;
        if ((puVar1 <= __src) || (puVar18 = puVar12 + 1, puVar1 < puVar18)) goto LAB_00113668;
        uVar19 = (ulong)(byte)*__src;
        __src = puVar18;
        if (uVar19 == 0xff) {
          uVar19 = 0xff;
          do {
            puVar12 = puVar18;
            __src = (ushort *)((long)puVar12 + 1);
            if (puVar1 < __src) goto LAB_00113a67;
            uVar19 = uVar19 + (byte)*puVar12;
            puVar18 = __src;
          } while ((ulong)(byte)*puVar12 == 0xff);
          if (uVar19 == 0xffffffffffffffff) {
LAB_00113a67:
            puVar18 = (ushort *)((long)puVar12 + 1);
LAB_00113668:
            local_58 = (int)source;
            return ~(uint)puVar18 + local_58;
          }
        }
        uVar19 = uVar19 + 0xf;
        puVar18 = __src;
        if ((CARRY8((ulong)__dest,uVar19)) || (CARRY8((ulong)__src,uVar19))) goto LAB_00113668;
LAB_00113759:
        pbVar16 = __dest + uVar19;
        if ((pbVar3 + -0xc < pbVar16) ||
           (puVar12 = (ushort *)((long)__src + uVar19), pbVar2 + -8 < puVar12)) {
          pbVar17 = pbVar16;
          if (pbVar2 < (byte *)((long)__src + uVar19)) {
            pbVar17 = __dest + ((long)pbVar2 - (long)__src);
          }
          if (pbVar3 < pbVar17) {
            memmove(__dest,__src,(long)pbVar3 - (long)__dest);
            pbVar16 = pbVar3;
LAB_00113a25:
            return (int)pbVar16 - (int)dest;
          }
          if (pbVar2 < (byte *)((long)__src + uVar19)) {
            uVar19 = (long)pbVar2 - (long)__src;
          }
          memmove(__dest,__src,uVar19);
          pbVar16 = __dest + uVar19;
          if ((pbVar17 == pbVar3) ||
             (puVar12 = (ushort *)((long)__src + uVar19), pbVar2 + -2 <= puVar12))
          goto LAB_00113a25;
        }
        else {
          do {
            *(undefined8 *)__dest = *(undefined8 *)__src;
            __dest = __dest + 8;
            __src = __src + 4;
          } while (__dest < pbVar16);
        }
        uVar20 = (ulong)*puVar12;
        puVar12 = puVar12 + 1;
        pbVar17 = pbVar16 + -uVar20;
        uVar15 = (ulong)(uVar14 & 0xf);
LAB_00113807:
        puVar18 = puVar12;
        if ((int)uVar15 == 0xf) {
          puVar18 = (ushort *)((long)puVar12 + 1);
          if (pbVar2 + -4 < puVar18) goto LAB_00113668;
          uVar19 = (ulong)(byte)*puVar12;
          if (uVar19 == 0xff) {
            uVar19 = 0xff;
            puVar12 = puVar18;
            do {
              puVar18 = (ushort *)((long)puVar12 + 1);
              if (pbVar2 + -4 < puVar18) {
                puVar18 = (ushort *)((long)puVar12 + 1);
                goto LAB_00113668;
              }
              uVar6 = *puVar12;
              uVar19 = uVar19 + (byte)uVar6;
              puVar12 = puVar18;
            } while ((ulong)(byte)uVar6 == 0xff);
          }
          uVar15 = uVar19 + 0xf;
          if ((uVar19 == 0xffffffffffffffff) || (CARRY8((ulong)pbVar16,uVar15))) goto LAB_00113668;
        }
        uVar15 = uVar15 + 4;
        puVar12 = puVar18;
      } while( true );
    }
  }
  return iVar9;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_partial_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int targetOutputSize, int dstCapacity,
                                     const void* dictStart, size_t dictSize)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(source, dest, compressedSize, dstCapacity,
                                  partial_decode, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}